

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCxxModuleBmiGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallCxxModuleBmiGenerator::GenerateScriptForConfig
          (cmInstallCxxModuleBmiGenerator *this,ostream *os,string *config,Indent indent)

{
  ostream *poVar1;
  WrapQuotes in_R8D;
  string_view str;
  string local_58;
  string local_38;
  
  GetScriptLocation(&local_38,this,config);
  if ((cmOutputConverter *)local_38._M_string_length != (cmOutputConverter *)0x0) {
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"include(\"",9);
    str._M_str = (char *)0x1;
    str._M_len = (size_t)local_38._M_dataplus._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&local_58,(cmOutputConverter *)local_38._M_string_length,str,in_R8D);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" OPTIONAL)\n",0xc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallCxxModuleBmiGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  auto const& loc = this->GetScriptLocation(config);
  if (loc.empty()) {
    return;
  }
  os << indent << "include(\""
     << cmOutputConverter::EscapeForCMake(
          loc, cmOutputConverter::WrapQuotes::NoWrap)
     << "\" OPTIONAL)\n";
}